

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_resampler.cpp
# Opt level: O0

Sample * __thiscall crnlib::Resampler::get_line(Resampler *this)

{
  long lVar1;
  int iVar2;
  long in_RDI;
  int i;
  Resampler *in_stack_00000020;
  int local_14;
  Sample *local_8;
  
  if (*(int *)(in_RDI + 100) == *(int *)(in_RDI + 0x14)) {
    local_8 = (Sample *)0x0;
  }
  else {
    for (local_14 = 0;
        local_14 <
        (int)(uint)*(ushort *)(*(long *)(in_RDI + 0x38) + (long)*(int *)(in_RDI + 100) * 0x10);
        local_14 = local_14 + 1) {
      lVar1 = *(long *)(in_RDI + 0x50);
      iVar2 = resampler_range_check
                        ((uint)*(ushort *)
                                (*(long *)(*(long *)(in_RDI + 0x38) +
                                           (long)*(int *)(in_RDI + 100) * 0x10 + 8) + 4 +
                                (long)local_14 * 8),*(int *)(in_RDI + 0xc));
      if (*(char *)(lVar1 + iVar2) == '\0') {
        return (Sample *)0x0;
      }
    }
    resample_y(in_stack_00000020,(Sample *)this);
    *(int *)(in_RDI + 100) = *(int *)(in_RDI + 100) + 1;
    local_8 = *(Sample **)(in_RDI + 0x20);
  }
  return local_8;
}

Assistant:

const Resampler::Sample* Resampler::get_line() {
  int i;

  /* If all the destination lines have been
      * generated, then always return NULL.
      */

  if (m_cur_dst_y == m_resample_dst_y)
    return NULL;

  /* Check to see if all the required
      * contributors are present, if not,
      * return NULL.
      */

  for (i = 0; i < m_Pclist_y[m_cur_dst_y].n; i++)
    if (!m_Psrc_y_flag[resampler_range_check(m_Pclist_y[m_cur_dst_y].p[i].pixel, m_resample_src_y)])
      return NULL;

  resample_y(m_Pdst_buf);

  m_cur_dst_y++;

  return m_Pdst_buf;
}